

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedString::GenerateInlineAccessorDefinitions
          (RepeatedString *this,Printer *p)

{
  long *plVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  bool bytes;
  long alStack_310 [4];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  vStack_2f0;
  long alStack_2c8 [5];
  undefined1 auStack_2a0 [32];
  Printer *local_280;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  undefined8 uStack_260;
  Sub local_258;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  long *local_180;
  undefined8 local_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  Sub local_e8;
  
  auStack_2a0[0x1e] = ((this->super_FieldGeneratorBase).field_)->type_ == '\f';
  auStack_2a0._16_8_ = 0x310aa6;
  local_280 = p;
  GetEmitRepeatedFieldGetterSub(&local_258,this->opts_,p);
  auStack_2a0._16_8_ = 0x310acf;
  local_278 = &local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"bytes_tag","");
  local_1a0 = local_190;
  if (local_278 == &local_268) {
    uStack_188 = uStack_260;
  }
  else {
    local_1a0 = local_278;
  }
  local_198 = local_270;
  local_270 = 0;
  local_268 = 0;
  auStack_2a0._16_8_ = 0x310b30;
  local_278 = &local_268;
  local_180 = (long *)operator_new(0x18);
  *local_180 = (long)(auStack_2a0 + 0x1e);
  local_180[1] = (long)&local_280;
  *(undefined1 *)(local_180 + 2) = 0;
  local_168 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_178 = 0;
  local_170 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_160 = 1;
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  auStack_2a0._16_8_ = 0x310ba5;
  std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x522f0c);
  local_f0 = 0;
  auStack_2a0._16_8_ = 0x310bc5;
  GetEmitRepeatedFieldMutableSub(&local_e8,this->opts_,local_280,false);
  auStack_2a0._16_8_ = 0x310be8;
  io::Printer::Emit(p,&local_258,3,0x9f7,
                    "\n        inline ::std::string* $nonnull$ $Msg$::add_$name$()\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMutation$;\n          ::std::string* _s = _internal_mutable_$name_internal$()->Add();\n          $annotate_add_mutable$;\n          // @@protoc_insertion_point(field_add_mutable:$pkg.Msg.field$)\n          return _s;\n        }\n        inline const ::std::string& $Msg$::$name$(int index) const\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_get$;\n          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)\n          return $getter$;\n        }\n        inline ::std::string* $nonnull$ $Msg$::mutable_$name$(int index)\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_mutable$;\n          // @@protoc_insertion_point(field_mutable:$pkg.Msg.field$)\n          return $mutable$;\n        }\n        template <typename Arg_, typename... Args_>\n        inline void $Msg$::set_$name$(int index, Arg_&& value, Args_... args) {\n          $WeakDescriptorSelfPin$;\n          $pbi$::AssignToString(*$mutable$, ::std::forward<Arg_>(value),\n                                args... $bytes_tag$);\n          $annotate_set$;\n          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)\n        }\n        template <typename Arg_, typename... Args_>\n        inline void $Msg$::add_$name$(Arg_&& value, Args_... args) {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMutation$;\n          $pbi$::AddToRepeatedPtrField(*_internal_mutable_$name_internal$(),\n                                       ::std::forward<Arg_>(value),\n                                       args... $bytes_tag$);\n          $annotate_add$;\n          // @@protoc_insertion_point(field_add:$pkg.Msg.field$)\n        }\n        inline const $pb$::RepeatedPtrField<::std::string>& $Msg$::$name$()\n            const ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_list$;\n   ..." /* TRUNCATED STRING LITERAL */
                   );
  lVar4 = 0x228;
  do {
    if (*(char *)((long)&uStack_260 + lVar4) == '\x01') {
      auStack_2a0._16_8_ = 0x310c0f;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (auStack_2a0 + lVar4));
    }
    plVar1 = (long *)((long)alStack_2c8 + lVar4 + 0x10);
    if (plVar1 != *(long **)((long)alStack_2c8 + lVar4)) {
      auStack_2a0._16_8_ = 0x310c2b;
      operator_delete(*(long **)((long)alStack_2c8 + lVar4),*plVar1 + 1);
    }
    auStack_2a0._16_8_ = 0x310c3e;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[*(byte *)((long)alStack_2c8 + lVar4 + -8)]._M_data)
              ((anon_class_1_0_00000001 *)(auStack_2a0 + 0x1f),
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)((long)&vStack_2f0.
                          super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                          .
                          super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                  + lVar4));
    plVar1 = (long *)((long)alStack_310 + lVar4 + 0x10);
    *(undefined1 *)((long)alStack_2c8 + lVar4 + -8) = 0xff;
    if (plVar1 != *(long **)((long)alStack_310 + lVar4)) {
      auStack_2a0._16_8_ = 0x310c5e;
      operator_delete(*(long **)((long)alStack_310 + lVar4),*plVar1 + 1);
    }
    lVar4 = lVar4 + -0xb8;
  } while (lVar4 != 0);
  if (local_278 != &local_268) {
    auStack_2a0._16_8_ = 0x310c7e;
    operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
  }
  if ((this->super_FieldGeneratorBase).should_split_ == true) {
    pcVar3 = 
    "\n      inline const $pb$::RepeatedPtrField<::std::string>&\n      $Msg$::_internal_$name_internal$() const {\n        $TsanDetectConcurrentRead$;\n        return *$field_$;\n      }\n      inline $pb$::RepeatedPtrField<::std::string>* $nonnull$\n      $Msg$::_internal_mutable_$name_internal$() {\n        $TsanDetectConcurrentRead$;\n        $PrepareSplitMessageForWrite$;\n        if ($field_$.IsDefault()) {\n          $field_$.Set(\n              $pb$::Arena::Create<$pb$::RepeatedPtrField<::std::string>>(\n                  GetArena()));\n        }\n        return $field_$.Get();\n      }\n    "
    ;
    uVar2 = 0x249;
  }
  else {
    pcVar3 = 
    "\n      inline const $pb$::RepeatedPtrField<::std::string>&\n      $Msg$::_internal_$name_internal$() const {\n        $TsanDetectConcurrentRead$;\n        return $field_$;\n      }\n      inline $pb$::RepeatedPtrField<::std::string>* $nonnull$\n      $Msg$::_internal_mutable_$name_internal$() {\n        $TsanDetectConcurrentRead$;\n        return &$field_$;\n      }\n    "
    ;
    uVar2 = 0x16c;
  }
  auStack_2a0._16_8_ = 0x310cad;
  io::Printer::Emit(local_280,0,0,uVar2,pcVar3);
  return;
}

Assistant:

void RepeatedString::GenerateInlineAccessorDefinitions(io::Printer* p) const {
  bool bytes = field_->type() == FieldDescriptor::TYPE_BYTES;
  p->Emit(
      {
          GetEmitRepeatedFieldGetterSub(*opts_, p),
          {"bytes_tag",
           [&] {
             if (bytes) {
               p->Emit(", $pbi$::BytesTag{}");
             }
           }},
          GetEmitRepeatedFieldMutableSub(*opts_, p),
      },
      R"cc(
        inline ::std::string* $nonnull$ $Msg$::add_$name$()
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          ::std::string* _s = _internal_mutable_$name_internal$()->Add();
          $annotate_add_mutable$;
          // @@protoc_insertion_point(field_add_mutable:$pkg.Msg.field$)
          return _s;
        }
        inline const ::std::string& $Msg$::$name$(int index) const
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_get$;
          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)
          return $getter$;
        }
        inline ::std::string* $nonnull$ $Msg$::mutable_$name$(int index)
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_mutable$;
          // @@protoc_insertion_point(field_mutable:$pkg.Msg.field$)
          return $mutable$;
        }
        template <typename Arg_, typename... Args_>
        inline void $Msg$::set_$name$(int index, Arg_&& value, Args_... args) {
          $WeakDescriptorSelfPin$;
          $pbi$::AssignToString(*$mutable$, ::std::forward<Arg_>(value),
                                args... $bytes_tag$);
          $annotate_set$;
          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)
        }
        template <typename Arg_, typename... Args_>
        inline void $Msg$::add_$name$(Arg_&& value, Args_... args) {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $pbi$::AddToRepeatedPtrField(*_internal_mutable_$name_internal$(),
                                       ::std::forward<Arg_>(value),
                                       args... $bytes_tag$);
          $annotate_add$;
          // @@protoc_insertion_point(field_add:$pkg.Msg.field$)
        }
        inline const $pb$::RepeatedPtrField<::std::string>& $Msg$::$name$()
            const ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_list$;
          // @@protoc_insertion_point(field_list:$pkg.Msg.field$)
          return _internal_$name_internal$();
        }
        inline $pb$::RepeatedPtrField<::std::string>* $nonnull$
        $Msg$::mutable_$name$() ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_mutable_list$;
          // @@protoc_insertion_point(field_mutable_list:$pkg.Msg.field$)
          $TsanDetectConcurrentMutation$;
          return _internal_mutable_$name_internal$();
        }
      )cc");
  if (should_split()) {
    p->Emit(R"cc(
      inline const $pb$::RepeatedPtrField<::std::string>&
      $Msg$::_internal_$name_internal$() const {
        $TsanDetectConcurrentRead$;
        return *$field_$;
      }
      inline $pb$::RepeatedPtrField<::std::string>* $nonnull$
      $Msg$::_internal_mutable_$name_internal$() {
        $TsanDetectConcurrentRead$;
        $PrepareSplitMessageForWrite$;
        if ($field_$.IsDefault()) {
          $field_$.Set(
              $pb$::Arena::Create<$pb$::RepeatedPtrField<::std::string>>(
                  GetArena()));
        }
        return $field_$.Get();
      }
    )cc");
  } else {
    p->Emit(R"cc(
      inline const $pb$::RepeatedPtrField<::std::string>&
      $Msg$::_internal_$name_internal$() const {
        $TsanDetectConcurrentRead$;
        return $field_$;
      }
      inline $pb$::RepeatedPtrField<::std::string>* $nonnull$
      $Msg$::_internal_mutable_$name_internal$() {
        $TsanDetectConcurrentRead$;
        return &$field_$;
      }
    )cc");
  }
}